

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int blobSeekToRow(Incrblob *p,sqlite3_int64 iRow,char **pzErr)

{
  long lVar1;
  u32 uVar2;
  undefined8 *in_RDX;
  undefined8 in_RSI;
  u32 *in_RDI;
  u32 type;
  VdbeCursor *pC;
  Vdbe *v;
  char *zErr;
  int rc;
  Vdbe *in_stack_00000a00;
  sqlite3 *db;
  char *local_50;
  sqlite3 *in_stack_ffffffffffffffb8;
  uint local_40;
  char *pcVar3;
  int local_1c;
  
  pcVar3 = (char *)0x0;
  lVar1 = *(long *)(in_RDI + 6);
  *(undefined2 *)(*(long *)(lVar1 + 0x70) + 0x40) = 4;
  *(undefined8 *)(*(long *)(lVar1 + 0x70) + 0x38) = in_RSI;
  if (*(int *)(lVar1 + 0x34) < 5) {
    local_1c = sqlite3_step((sqlite3_stmt *)0x0);
  }
  else {
    *(undefined4 *)(lVar1 + 0x34) = 4;
    local_1c = sqlite3VdbeExec(in_stack_00000a00);
  }
  if (local_1c == 100) {
    lVar1 = **(long **)(lVar1 + 0x98);
    if ((ushort)in_RDI[2] < *(ushort *)(lVar1 + 0x4a)) {
      local_40 = *(uint *)(lVar1 + 0x70 + (ulong)(ushort)in_RDI[2] * 4);
    }
    else {
      local_40 = 0;
    }
    if (local_40 < 0xc) {
      in_stack_ffffffffffffffb8 = *(sqlite3 **)(in_RDI + 8);
      if (local_40 == 0) {
        local_50 = "null";
      }
      else {
        local_50 = "integer";
        if (local_40 == 7) {
          local_50 = "real";
        }
      }
      pcVar3 = sqlite3MPrintf(in_stack_ffffffffffffffb8,"cannot open value of type %s",local_50);
      local_1c = 1;
      sqlite3_finalize((sqlite3_stmt *)in_stack_ffffffffffffffb8);
      in_RDI[6] = 0;
      in_RDI[7] = 0;
    }
    else {
      in_RDI[1] = *(u32 *)(lVar1 + 0x70 +
                          (long)(int)((uint)(ushort)in_RDI[2] + (int)*(short *)(lVar1 + 0x48)) * 4);
      uVar2 = sqlite3VdbeSerialTypeLen(local_40);
      *in_RDI = uVar2;
      *(undefined8 *)(in_RDI + 4) = *(undefined8 *)(lVar1 + 0x30);
      sqlite3BtreeIncrblobCursor(*(BtCursor **)(in_RDI + 4));
    }
  }
  if (local_1c == 100) {
    local_1c = 0;
  }
  else if (*(long *)(in_RDI + 6) != 0) {
    local_1c = sqlite3_finalize((sqlite3_stmt *)in_stack_ffffffffffffffb8);
    in_RDI[6] = 0;
    in_RDI[7] = 0;
    if (local_1c == 0) {
      pcVar3 = sqlite3MPrintf(*(sqlite3 **)(in_RDI + 8),"no such rowid: %lld",in_RSI);
      local_1c = 1;
    }
    else {
      db = *(sqlite3 **)(in_RDI + 8);
      pcVar3 = sqlite3_errmsg(db);
      pcVar3 = sqlite3MPrintf(db,"%s",pcVar3);
    }
  }
  *in_RDX = pcVar3;
  return local_1c;
}

Assistant:

static int blobSeekToRow(Incrblob *p, sqlite3_int64 iRow, char **pzErr){
  int rc;                         /* Error code */
  char *zErr = 0;                 /* Error message */
  Vdbe *v = (Vdbe *)p->pStmt;

  /* Set the value of register r[1] in the SQL statement to integer iRow. 
  ** This is done directly as a performance optimization
  */
  v->aMem[1].flags = MEM_Int;
  v->aMem[1].u.i = iRow;

  /* If the statement has been run before (and is paused at the OP_ResultRow)
  ** then back it up to the point where it does the OP_NotExists.  This could
  ** have been down with an extra OP_Goto, but simply setting the program
  ** counter is faster. */
  if( v->pc>4 ){
    v->pc = 4;
    assert( v->aOp[v->pc].opcode==OP_NotExists );
    rc = sqlite3VdbeExec(v);
  }else{
    rc = sqlite3_step(p->pStmt);
  }
  if( rc==SQLITE_ROW ){
    VdbeCursor *pC = v->apCsr[0];
    u32 type = pC->nHdrParsed>p->iCol ? pC->aType[p->iCol] : 0;
    testcase( pC->nHdrParsed==p->iCol );
    testcase( pC->nHdrParsed==p->iCol+1 );
    if( type<12 ){
      zErr = sqlite3MPrintf(p->db, "cannot open value of type %s",
          type==0?"null": type==7?"real": "integer"
      );
      rc = SQLITE_ERROR;
      sqlite3_finalize(p->pStmt);
      p->pStmt = 0;
    }else{
      p->iOffset = pC->aType[p->iCol + pC->nField];
      p->nByte = sqlite3VdbeSerialTypeLen(type);
      p->pCsr =  pC->uc.pCursor;
      sqlite3BtreeIncrblobCursor(p->pCsr);
    }
  }

  if( rc==SQLITE_ROW ){
    rc = SQLITE_OK;
  }else if( p->pStmt ){
    rc = sqlite3_finalize(p->pStmt);
    p->pStmt = 0;
    if( rc==SQLITE_OK ){
      zErr = sqlite3MPrintf(p->db, "no such rowid: %lld", iRow);
      rc = SQLITE_ERROR;
    }else{
      zErr = sqlite3MPrintf(p->db, "%s", sqlite3_errmsg(p->db));
    }
  }

  assert( rc!=SQLITE_OK || zErr==0 );
  assert( rc!=SQLITE_ROW && rc!=SQLITE_DONE );

  *pzErr = zErr;
  return rc;
}